

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

EdgeCrossingResult * __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdgeCrossings
          (EdgeCrossingResult *__return_storage_ptr__,CrossingProcessor *this,ShapeEdgeId a_id,
          Edge *a,CrossingIterator *it)

{
  S2Point *v;
  double dVar1;
  double dVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  IndexCrossing *pIVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  double *ap_1;
  double *ap;
  bool bVar16;
  Edge b;
  int local_b0;
  int local_a4;
  double local_78 [6];
  EdgeCrossingResult *local_48;
  undefined1 local_40 [9];
  undefined7 uStack_37;
  
  __return_storage_ptr__->a0_crossings = 0;
  __return_storage_ptr__->a1_crossings = 0;
  iVar15 = 0;
  __return_storage_ptr__->interior_crossings = 0;
  __return_storage_ptr__->matches_polyline = false;
  __return_storage_ptr__->matches_polygon = false;
  __return_storage_ptr__->matches_sibling = false;
  __return_storage_ptr__->a0_matches_polyline = false;
  __return_storage_ptr__->a0_matches_polyline = false;
  __return_storage_ptr__->a1_matches_polyline = false;
  __return_storage_ptr__->a0_matches_polygon = false;
  __return_storage_ptr__->a1_matches_polygon = false;
  pIVar11 = (it->it_)._M_current;
  if (pIVar11->a == a_id) {
    v = &a->v1;
    bVar13 = false;
    bVar12 = false;
    bVar8 = false;
    bVar7 = false;
    bVar5 = false;
    bVar6 = false;
    local_a4 = 0;
    local_b0 = 0;
    bVar4 = false;
    local_48 = __return_storage_ptr__;
    do {
      if (it->b_dimension_ != 0) {
        (*it->b_shape_->_vptr_S2Shape[3])(local_78,it->b_shape_,(ulong)(uint)(pIVar11->b).edge_id);
        pIVar11 = (it->it_)._M_current;
        bVar3 = pIVar11->field_0x10;
        if ((bVar3 & 1) == 0) {
          if (it->b_dimension_ == 1) {
            if (this->a_dimension_ != 2) {
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
LAB_0019de90:
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
                  lVar10 = 0;
                  do {
                    dVar1 = *(double *)((long)v->c_ + lVar10);
                    dVar2 = *(double *)((long)local_78 + lVar10);
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                    bVar16 = lVar10 != 0x10;
                    lVar10 = lVar10 + 8;
                  } while (bVar16);
                  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_0019dee6;
                }
              }
              else {
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)v->c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019de90;
LAB_0019dee6:
                bVar4 = true;
              }
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_0019df43;
              }
              else {
LAB_0019df43:
                bVar16 = PolylineEdgeContainsVertex(this,&a->v0,it);
                if (bVar16) {
                  bVar12 = true;
                }
              }
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)v->c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)v->c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019e246;
              }
              bVar16 = PolylineEdgeContainsVertex(this,v,it);
              if (bVar16) {
                bVar13 = true;
              }
            }
          }
          else {
            if (it->b_dimension_ != 2) {
              local_48->matches_sibling = bVar6;
              local_48->matches_polygon = bVar5;
              local_48->a0_matches_polygon = bVar7;
              local_48->a1_matches_polygon = bVar8;
              local_48->a0_matches_polyline = bVar12;
              local_48->a1_matches_polyline = bVar13;
              local_48->interior_crossings = iVar15;
              local_48->a1_crossings = local_a4;
              local_48->a0_crossings = local_b0;
              local_48->matches_polyline = bVar4;
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)local_40,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                         ,0x667,kFatal,(ostream *)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)CONCAT71(uStack_37,local_40[8]),
                         "Check failed: (2) == (it->b_dimension()) ",0x29);
              abort();
            }
            lVar10 = 0;
            do {
              dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
              dVar2 = *(double *)((long)local_78 + lVar10);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar16 = lVar10 != 0x10;
              lVar10 = lVar10 + 8;
            } while (bVar16);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
LAB_0019e0c3:
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)v->c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
                  local_b0 = local_b0 + 1;
                  bVar6 = true;
                  goto LAB_0019e18c;
                }
              }
              if ((bVar3 & 4) != 0) {
                lVar10 = 0;
                do {
                  dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                  dVar2 = *(double *)((long)local_78 + lVar10);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                  bVar16 = lVar10 != 0x10;
                  lVar10 = lVar10 + 8;
                } while (bVar16);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                  lVar10 = 0;
                  do {
                    dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                    dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                    bVar16 = lVar10 != 0x10;
                    lVar10 = lVar10 + 8;
                  } while (bVar16);
                  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
                    local_a4 = local_a4 + 1;
                    goto LAB_0019e18c;
                  }
                }
                local_b0 = local_b0 + 1;
              }
            }
            else {
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)v->c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019e0c3;
              local_b0 = local_b0 + 1;
              bVar5 = true;
            }
LAB_0019e18c:
            lVar10 = 0;
            do {
              dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
              dVar2 = *(double *)((long)local_78 + lVar10);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar16 = lVar10 != 0x10;
              lVar10 = lVar10 + 8;
            } while (bVar16);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)(a->v0).c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_0019e1e2;
            }
            else {
LAB_0019e1e2:
              bVar7 = true;
            }
            lVar10 = 0;
            do {
              dVar1 = *(double *)((long)v->c_ + lVar10);
              dVar2 = *(double *)((long)local_78 + lVar10);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
              bVar16 = lVar10 != 0x10;
              lVar10 = lVar10 + 8;
            } while (bVar16);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
              lVar10 = 0;
              do {
                dVar1 = *(double *)((long)v->c_ + lVar10);
                dVar2 = *(double *)((long)local_78 + lVar10 + 0x18);
                if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
                bVar16 = lVar10 != 0x10;
                lVar10 = lVar10 + 8;
              } while (bVar16);
              if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) goto LAB_0019e246;
            }
            bVar8 = true;
          }
        }
        else {
          iVar14 = it->b_dimension_;
          if (iVar14 < this->a_dimension_) {
LAB_0019e03e:
            iVar9 = 1;
            if (iVar14 == 1) goto LAB_0019e048;
          }
          else {
            if ((iVar14 != 1) || (this->invert_b_ == this->invert_result_)) {
              local_40[8] = (bool)(bVar3 >> 1 & 1);
              local_40._4_4_ = (pIVar11->b).edge_id;
              local_40._0_4_ = (this->b_region_id_ & 1U) + it->b_shape_id_ * 2;
              AddCrossing(this,(SourceEdgeCrossing *)local_40);
              iVar14 = it->b_dimension_;
              goto LAB_0019e03e;
            }
LAB_0019e048:
            iVar9 = 2;
          }
          iVar15 = iVar15 + iVar9;
        }
LAB_0019e246:
        pIVar11 = (it->it_)._M_current;
      }
      (it->it_)._M_current = pIVar11 + 1;
      CrossingIterator::Update(it);
      pIVar11 = (it->it_)._M_current;
    } while (pIVar11->a == a_id);
    local_48->matches_sibling = bVar6;
    local_48->matches_polygon = bVar5;
    local_48->a0_matches_polygon = bVar7;
    local_48->a1_matches_polygon = bVar8;
    local_48->a0_matches_polyline = bVar12;
    local_48->a1_matches_polyline = bVar13;
    local_48->interior_crossings = iVar15;
    local_48->a1_crossings = local_a4;
    local_48->a0_crossings = local_b0;
    local_48->matches_polyline = bVar4;
    __return_storage_ptr__ = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

EdgeCrossingResult()
      : matches_polyline(false), matches_polygon(false), matches_sibling(false),
        a0_matches_polyline(false), a1_matches_polyline(false),
        a0_matches_polygon(false), a1_matches_polygon(false),
        a0_crossings(0), a1_crossings(0), interior_crossings(0) {
  }